

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waveform_to_spectrum.cc
# Opt level: O2

void __thiscall
sptk::WaveformToSpectrum::WaveformToSpectrum
          (WaveformToSpectrum *this,int frame_length,int fft_length,InputOutputFormats output_format
          ,double epsilon,double relative_floor_in_decibels)

{
  allocator_type local_19;
  value_type_conflict local_18;
  
  this->_vptr_WaveformToSpectrum = (_func_int **)&PTR__WaveformToSpectrum_001148d0;
  FilterCoefficientsToSpectrum::FilterCoefficientsToSpectrum
            (&this->filter_coefficients_to_spectrum_,frame_length + -1,0,fft_length,output_format,
             epsilon,relative_floor_in_decibels);
  local_18 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->dummy_for_filter_coefficients_to_spectrum_,1,&local_18,&local_19);
  return;
}

Assistant:

WaveformToSpectrum::WaveformToSpectrum(
    int frame_length, int fft_length,
    SpectrumToSpectrum::InputOutputFormats output_format, double epsilon,
    double relative_floor_in_decibels)
    : filter_coefficients_to_spectrum_(frame_length - 1, 0, fft_length,
                                       output_format, epsilon,
                                       relative_floor_in_decibels),
      dummy_for_filter_coefficients_to_spectrum_(1, 1.0) {
}